

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O3

void __thiscall JFSON::anon_unknown_22::JsonParser::consume_garbage(JsonParser *this)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  pointer pcVar6;
  string *psVar7;
  long local_50;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  psVar7 = this->str;
  sVar4 = this->i;
  pcVar6 = (psVar7->_M_dataplus)._M_p;
  while ((uVar5 = (ulong)(byte)pcVar6[sVar4], uVar5 < 0x21 &&
         ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0))) {
    sVar4 = sVar4 + 1;
    this->i = sVar4;
  }
  if (this->strategy == COMMENTS) {
    do {
      if ((char)uVar5 == '/') {
        uVar5 = sVar4 + 1;
        this->i = uVar5;
        uVar2 = psVar7->_M_string_length;
        local_48 = local_38;
        if (uVar5 == uVar2) {
          local_50 = 0x2e;
          local_48 = (long *)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
          *local_48 = 0x7463657078656e75;
          local_48[1] = 0x6f20646e65206465;
          local_48[2] = 0x207475706e692066;
          local_48[3] = 0x7473207265746661;
          builtin_strncpy((char *)((long)local_48 + 0x1e),"start of",8);
          builtin_strncpy((char *)((long)local_48 + 0x26)," comment",8);
          local_38[0] = local_50;
LAB_00105f41:
          *(char *)((long)local_48 + local_38[0]) = '\0';
          local_50 = local_38[0];
          local_40 = local_38[0];
          if (this->failed == false) {
            std::__cxx11::string::operator=((string *)this->err,(string *)&local_48);
          }
          this->failed = true;
          if (local_48 != local_38) {
            operator_delete(local_48);
          }
          goto LAB_00105f6a;
        }
        if (pcVar6[uVar5] == '*') {
          uVar5 = sVar4 + 2;
          this->i = uVar5;
          while (uVar5 <= uVar2 - 2) {
            if ((pcVar6[uVar5] == '*') && (pcVar6[uVar5 + 1] == '/')) {
              this->i = uVar5 + 2;
              bVar3 = true;
              goto LAB_00105f6c;
            }
            uVar5 = uVar5 + 1;
            this->i = uVar5;
          }
          local_50 = 0x31;
          local_48 = (long *)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
          *local_48 = 0x7463657078656e75;
          local_48[1] = 0x6f20646e65206465;
          local_48[2] = 0x207475706e692066;
          local_48[3] = 0x6d20656469736e69;
          local_48[4] = 0x6e696c2d69746c75;
          local_48[5] = 0x6e656d6d6f632065;
          *(char *)(local_48 + 6) = 't';
          local_38[0] = local_50;
          goto LAB_00105f41;
        }
        if (pcVar6[uVar5] != '/') {
          local_50 = 0x11;
          local_48 = (long *)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
          local_38[0] = local_50;
          *local_48 = 0x656d726f666c616d;
          local_48[1] = 0x6e656d6d6f632064;
          *(char *)(local_48 + 2) = 't';
          goto LAB_00105f41;
        }
        uVar5 = sVar4 + 2;
        do {
          this->i = uVar5;
          bVar3 = true;
          if (uVar2 <= uVar5) break;
          pcVar1 = pcVar6 + uVar5;
          uVar5 = uVar5 + 1;
        } while (*pcVar1 != '\n');
      }
      else {
LAB_00105f6a:
        bVar3 = false;
      }
LAB_00105f6c:
      if (this->failed != false) {
        return;
      }
      psVar7 = this->str;
      sVar4 = this->i;
      pcVar6 = (psVar7->_M_dataplus)._M_p;
      while ((uVar5 = (ulong)(byte)pcVar6[sVar4], uVar5 < 0x21 &&
             ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0))) {
        sVar4 = sVar4 + 1;
        this->i = sVar4;
      }
    } while (bVar3);
  }
  return;
}

Assistant:

void consume_garbage() {
      consume_whitespace();
      if(strategy == JsonParse::COMMENTS) {
        bool comment_found = false;
        do {
          comment_found = consume_comment();
          if (failed) return;
          consume_whitespace();
        }
        while(comment_found);
      }
    }